

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytesinkutil.cpp
# Opt level: O0

char * __thiscall
icu_63::CharStringByteSink::GetAppendBuffer
          (CharStringByteSink *this,int32_t min_capacity,int32_t desired_capacity_hint,char *scratch
          ,int32_t scratch_capacity,int32_t *result_capacity)

{
  UBool UVar1;
  CharStringByteSink *pCVar2;
  char *result;
  int32_t *piStack_38;
  UErrorCode status;
  int32_t *result_capacity_local;
  CharStringByteSink *pCStack_28;
  int32_t scratch_capacity_local;
  char *scratch_local;
  int32_t desired_capacity_hint_local;
  int32_t min_capacity_local;
  CharStringByteSink *this_local;
  
  if ((min_capacity < 1) || (scratch_capacity < min_capacity)) {
    *result_capacity = 0;
    this_local = (CharStringByteSink *)0x0;
  }
  else {
    result._4_4_ = U_ZERO_ERROR;
    piStack_38 = result_capacity;
    result_capacity_local._4_4_ = scratch_capacity;
    pCStack_28 = (CharStringByteSink *)scratch;
    scratch_local._0_4_ = desired_capacity_hint;
    scratch_local._4_4_ = min_capacity;
    _desired_capacity_hint_local = this;
    pCVar2 = (CharStringByteSink *)
             CharString::getAppendBuffer
                       (this->dest_,min_capacity,desired_capacity_hint,result_capacity,
                        (UErrorCode *)((long)&result + 4));
    UVar1 = ::U_SUCCESS(result._4_4_);
    this_local = pCVar2;
    if (UVar1 == '\0') {
      *piStack_38 = result_capacity_local._4_4_;
      this_local = pCStack_28;
    }
  }
  return (char *)this_local;
}

Assistant:

char*
CharStringByteSink::GetAppendBuffer(int32_t min_capacity,
                                    int32_t desired_capacity_hint,
                                    char* scratch,
                                    int32_t scratch_capacity,
                                    int32_t* result_capacity) {
    if (min_capacity < 1 || scratch_capacity < min_capacity) {
        *result_capacity = 0;
        return nullptr;
    }

    UErrorCode status = U_ZERO_ERROR;
    char* result = dest_.getAppendBuffer(
            min_capacity,
            desired_capacity_hint,
            *result_capacity,
            status);
    if (U_SUCCESS(status)) {
        return result;
    }

    *result_capacity = scratch_capacity;
    return scratch;
}